

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimvcd.cpp
# Opt level: O1

ModuleTreeNode * __thiscall
BtorSimVCDWriter::sort_names(BtorSimVCDWriter *this,Btor2Parser *model,string *topname)

{
  pointer pcVar1;
  Btor2Parser *pBVar2;
  undefined1 auVar3 [8];
  ModuleTreeNode *pMVar4;
  _Rb_tree_header *p_Var5;
  Btor2Line *pBVar6;
  Btor2Sort *pBVar7;
  _Base_ptr p_Var8;
  long lVar9;
  pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  i;
  allocator local_f9;
  BtorSimVCDWriter *local_f8;
  _Rb_tree_node_base *local_f0;
  ModuleTreeNode *local_e8;
  Btor2Parser *local_e0;
  undefined1 local_d8 [8];
  _Alloc_hider local_d0;
  char local_c0 [16];
  _Alloc_hider local_b0;
  char local_a0 [16];
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  local_f8 = this;
  pMVar4 = (ModuleTreeNode *)operator_new(0x68);
  pcVar1 = (topname->_M_dataplus)._M_p;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + topname->_M_string_length);
  (pMVar4->name)._M_dataplus._M_p = (pointer)&(pMVar4->name).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)pMVar4,local_90,local_90 + local_88);
  p_Var5 = &(pMVar4->wire_names)._M_t._M_impl.super__Rb_tree_header;
  (pMVar4->wire_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pMVar4->wire_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pMVar4->wire_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
  (pMVar4->wire_names)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
  (pMVar4->wire_names)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pMVar4->submodules).super__Vector_base<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pMVar4->submodules).super__Vector_base<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pMVar4->submodules).super__Vector_base<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8 = pMVar4;
  local_e0 = model;
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  p_Var8 = (local_f8->bv_identifiers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_f0 = &(local_f8->bv_identifiers)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var8 != local_f0) {
    do {
      local_d8 = *(undefined1 (*) [8])(p_Var8 + 1);
      local_d0._M_p = local_c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,p_Var8[1]._M_parent,
                 (long)&(p_Var8[1]._M_parent)->_M_color + (long)&(p_Var8[1]._M_left)->_M_color);
      pBVar2 = local_e0;
      pBVar6 = (Btor2Line *)btor2parser_get_line_by_id(local_e0,local_d8);
      pBVar7 = get_sort(pBVar6,pBVar2);
      auVar3 = local_d8;
      std::__cxx11::string::string((string *)&local_50,pBVar6->symbol,&local_f9);
      ModuleTreeNode::sort_name
                (local_e8,(int64_t)auVar3,&local_50,(pBVar7->field_3).bitvec.width,
                 local_f8->symbol_fmt);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (local_d0._M_p != local_c0) {
        operator_delete(local_d0._M_p);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != local_f0);
  }
  pBVar2 = local_e0;
  p_Var8 = (local_f8->am_identifiers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_f0 = &(local_f8->am_identifiers)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var8 != local_f0) {
    do {
      std::
      pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair((pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_d8,
             (pair<const_std::pair<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(p_Var8 + 1));
      auVar3 = local_d8;
      pBVar6 = (Btor2Line *)btor2parser_get_line_by_id(pBVar2,local_d8);
      pBVar7 = get_sort(pBVar6,pBVar2);
      lVar9 = btor2parser_get_line_by_id(pBVar2,(pBVar7->field_3).array.element);
      std::__cxx11::string::string((string *)&local_70,pBVar6->symbol,&local_f9);
      ModuleTreeNode::sort_name
                (local_e8,(int64_t)auVar3,&local_70,*(uint32_t *)(lVar9 + 0x38),local_f8->symbol_fmt
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (local_b0._M_p != local_a0) {
        operator_delete(local_b0._M_p);
      }
      if (local_d0._M_p != local_c0) {
        operator_delete(local_d0._M_p);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != local_f0);
  }
  return local_e8;
}

Assistant:

ModuleTreeNode*
BtorSimVCDWriter::sort_names (Btor2Parser* model, std::string topname)
{
  ModuleTreeNode* top = new ModuleTreeNode (topname);
  for (auto i : bv_identifiers)
  {
    Btor2Line* l = btor2parser_get_line_by_id (model, i.first);
    assert (l);
    assert (l->symbol);
    Btor2Sort* sort = get_sort (l, model);
    assert (sort->tag == BTOR2_TAG_SORT_bitvec);
    top->sort_name (
        i.first, std::string (l->symbol), sort->bitvec.width, symbol_fmt);
  }
  for (auto i : am_identifiers)
  {
    int64_t id   = i.first.first;
    Btor2Line* l = btor2parser_get_line_by_id (model, id);
    assert (l);
    assert (l->symbol);
    Btor2Sort* sort = get_sort (l, model);
    assert (sort->tag == BTOR2_TAG_SORT_array);
    Btor2Line* le = btor2parser_get_line_by_id (model, sort->array.element);
    top->sort_name (
        id, std::string (l->symbol), le->sort.bitvec.width, symbol_fmt);
  }
  return top;
}